

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_parser.cc
# Opt level: O2

Response * __thiscall
iqxmlrpc::ResponseBuilder::get(Response *__return_storage_ptr__,ResponseBuilder *this)

{
  int fcode;
  Value *this_00;
  reference_type v;
  reference_type fstring;
  XML_RPC_violation *this_01;
  allocator<char> local_41;
  string local_40;
  
  if ((this->ok_).super_type.m_initialized == true) {
    this_00 = (Value *)operator_new(0x10);
    v = boost::optional<iqxmlrpc::Value>::get(&this->ok_);
    Value::Value(this_00,v);
    Response::Response(__return_storage_ptr__,this_00);
  }
  else {
    if ((this->fault_str_).super_type.m_initialized != true) {
      this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"No valid response was found",&local_41);
      XML_RPC_violation::XML_RPC_violation(this_01,&local_40);
      __cxa_throw(this_01,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
    }
    fcode = this->fault_code_;
    fstring = boost::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::get(&this->fault_str_);
    Response::Response(__return_storage_ptr__,fcode,fstring);
  }
  return __return_storage_ptr__;
}

Assistant:

Response
ResponseBuilder::get()
{
  if (ok_)
    return Response(new Value(ok_.get()));

  if (fault_str_)
    return Response(fault_code_, fault_str_.get());

  throw XML_RPC_violation("No valid response was found");
}